

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::memory::anon_unknown_0::testImage
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context,
          ImageParams params)

{
  string *psVar1;
  uint uVar2;
  TestStatus *pTVar3;
  DeviceInterface *vk;
  VkDeviceSize VVar4;
  deUint32 dVar5;
  TestLog *obj;
  bool bVar6;
  int iVar7;
  qpTestResult qVar8;
  InstanceInterface *vk_00;
  ostream *poVar9;
  pointer pcVar10;
  NotSupportedError *this_00;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  uint *puVar18;
  uint uVar19;
  VkImageType VVar20;
  VkSampleCountFlagBits VVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  VkFormatProperties VVar26;
  pointer local_680;
  deUint32 local_678;
  uint local_674;
  uint *local_670;
  undefined8 local_668;
  int local_65c;
  Context *local_658;
  VkPhysicalDevice local_650;
  InstanceInterface *local_648;
  vector<unsigned_int,_std::allocator<unsigned_int>_> usedMemoryTypeIndices;
  TestLog *local_628;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_620;
  TestLog *local_600;
  pointer local_5f8;
  uint local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  VkImageCreateInfo local_5e0;
  VkDevice local_588;
  ulong local_580;
  string local_578 [3];
  ios_base local_508 [264];
  TestStatus *local_400;
  ulong local_3f8;
  ulong local_3f0;
  DeviceInterface *local_3e8;
  ulong local_3e0;
  pointer local_3d8;
  VkMemoryRequirements requirements;
  ResultCollector result;
  VkBool32 local_368;
  VkBool32 local_364;
  VkBool32 local_360;
  VkBool32 local_340 [16];
  VkBool32 local_300;
  VkBool32 local_2fc;
  VkBool32 local_2f8;
  VkBool32 local_2f4;
  VkBool32 local_2f0;
  VkBool32 local_2ec;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  
  local_3e8 = Context::getDeviceInterface((Context *)this);
  vk_00 = Context::getInstanceInterface((Context *)this);
  local_588 = Context::getDevice((Context *)this);
  local_650 = Context::getPhysicalDevice((Context *)this);
  local_648 = vk_00;
  ::vk::getPhysicalDeviceFeatures((VkPhysicalDeviceFeatures *)&memoryProperties,vk_00,local_650);
  local_658 = context;
  if ((((ulong)context & 1) == 0) || (memoryProperties.memoryTypes[0x15].heapIndex != 0)) {
    if ((((ulong)context & 2) == 0) ||
       ((memoryProperties.memoryTypes[0x16].heapIndex != 0 ||
        (memoryProperties.memoryTypes[0x17].propertyFlags != 0)))) {
      if ((((ulong)context & 4) == 0) || (memoryProperties.memoryTypes[0x19].heapIndex != 0)) {
        local_400 = __return_storage_ptr__;
        ::vk::getPhysicalDeviceMemoryProperties(&memoryProperties,local_648,local_650);
        local_600 = *(TestLog **)(*(long *)this + 0x10);
        psVar1 = &result.m_prefix;
        result.m_log = local_600;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)psVar1,
                   "Verify memory requirements for the following parameter combinations:",0x44);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&result,(EndMessageToken *)&tcu::TestLog::EndMessage);
        uVar22 = (ulong)local_658 >> 0x20;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
        std::ios_base::~ios_base((ios_base *)local_340);
        local_5f0 = (params.flags & 1) << 6;
        bVar6 = true;
        local_65c = 0;
        uVar16 = 0;
        local_3f0 = uVar22;
        do {
          uVar13 = 1;
          local_678 = 0xffffffff;
          local_3f8 = uVar16;
          do {
            local_580 = uVar13;
            if (((int)local_3f8 == 1) != (int)uVar13 - 0x83U < 0xfffffff9) {
              if ((int)local_3f8 == 1) {
                local_678 = 0xffffffff;
              }
              VVar20 = VK_IMAGE_TYPE_1D;
              do {
                uVar16 = 0;
                do {
                  bVar23 = uVar22 == 0;
                  local_5e4 = (uint)uVar16 | (uint)local_658;
                  uVar11 = local_5e4 & 0x10;
                  local_5e8 = (uVar11 >> 4) * 5 + 1;
                  uVar12 = 1;
                  local_3e0 = uVar16;
                  do {
                    uVar19 = uVar12 | local_5f0;
                    local_5ec = uVar19 & 0xf0;
                    bVar24 = local_5ec != 0x40;
                    VVar21 = VK_SAMPLE_COUNT_1_BIT;
                    do {
                      local_5e0.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
                      local_5e0.pNext = (void *)0x0;
                      local_5e0.flags = local_5e4;
                      local_5e0.format = (VkFormat)local_580;
                      local_5e0.extent.depth = 1;
                      if (VVar20 == VK_IMAGE_TYPE_1D) {
                        local_5e0.extent.width = 0x40;
                        local_5e0.extent.height = 1;
                      }
                      else {
                        local_5e0.extent.depth = 1;
                        if (VVar20 != VK_IMAGE_TYPE_2D) {
                          local_5e0.extent.depth = 4;
                        }
                        local_5e0.extent.width = 0x40;
                        local_5e0.extent.height = 0x40;
                      }
                      local_5e0.mipLevels = 1;
                      local_5e0.arrayLayers = local_5e8;
                      local_5e0.tiling = (VkImageTiling)uVar22;
                      local_5e0.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
                      local_5e0.queueFamilyIndexCount = 0;
                      local_5e0.pQueueFamilyIndices = (deUint32 *)0x0;
                      local_5e0.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
                      local_5e0.imageType = VVar20;
                      local_5e0.samples = VVar21;
                      local_5e0.usage = uVar19;
                      if (VVar20 == VK_IMAGE_TYPE_2D || uVar11 == 0) {
                        if (VVar21 == VK_SAMPLE_COUNT_1_BIT) {
                          if (local_5ec != 0x40) {
LAB_006a8148:
                            ::vk::getPhysicalDeviceFeatures
                                      ((VkPhysicalDeviceFeatures *)&result,local_648,local_650);
                            if ((((local_5e0.flags & 2) == 0) ||
                                (((((local_5e0.imageType != VK_IMAGE_TYPE_2D || (local_300 != 0)) &&
                                   ((local_5e0.imageType != VK_IMAGE_TYPE_3D || (local_2fc != 0))))
                                  && (((local_5e0.samples != VK_SAMPLE_COUNT_2_BIT ||
                                       (local_2f8 != 0)) &&
                                      ((local_5e0.samples != VK_SAMPLE_COUNT_4_BIT ||
                                       (local_2f4 != 0)))))) &&
                                 ((((local_5e0.samples != VK_SAMPLE_COUNT_8_BIT || (local_2f0 != 0))
                                   && ((local_5e0.samples != VK_SAMPLE_COUNT_16_BIT ||
                                       (local_2ec != 0)))) &&
                                  ((local_5e0.samples != VK_SAMPLE_COUNT_32_BIT &&
                                   (local_5e0.samples != VK_SAMPLE_COUNT_64_BIT)))))))) &&
                               ((local_5e0.samples == VK_SAMPLE_COUNT_1_BIT ||
                                (((local_5e0.usage & 8) == 0 || (local_340[0] != 0)))))) {
                              uVar2 = local_5e0.format - VK_FORMAT_BC1_RGB_UNORM_BLOCK;
                              if (uVar2 < 0x36) {
                                if ((0x3ffffffc000000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
                                  if ((short)(1L << ((byte)uVar2 & 0x3f)) == 0) {
                                    if (local_368 != 0) goto LAB_006a8296;
                                  }
                                  else if (local_360 != 0) goto LAB_006a8296;
                                  goto LAB_006a8d4c;
                                }
                                if (local_364 == 0) goto LAB_006a8d4c;
                              }
LAB_006a8296:
                              VVar26 = ::vk::getPhysicalDeviceFormatProperties
                                                 (local_648,local_650,local_5e0.format);
                              uVar16 = VVar26._0_8_ >> 0x20;
                              if (local_5e0.tiling == VK_IMAGE_TILING_LINEAR) {
                                uVar16 = (ulong)VVar26.linearTilingFeatures;
                              }
                              if ((((((local_5e0.usage & 4) != 0) && ((uVar16 & 1) != 0)) ||
                                   (((local_5e0.usage & 8) != 0 && ((uVar16 & 2) != 0)))) ||
                                  ((((local_5e0.usage & 0x90) != 0 && ((uVar16 & 0x80) != 0)) ||
                                   (((local_5e0.usage & 0x20) != 0 && ((uVar16 & 0x200) != 0))))))
                                 && ((((iVar7 = (*local_648->_vptr_InstanceInterface[4])
                                                          (local_648,local_650,
                                                           (ulong)local_5e0.format,
                                                           (ulong)local_5e0.imageType,
                                                           (ulong)local_5e0.tiling,
                                                           (ulong)local_5e0.usage,
                                                           (ulong)local_5e0.flags,local_578),
                                       iVar7 == 0 &&
                                       (local_5e0.arrayLayers <= (uint)local_578[0].field_2._0_4_))
                                      && (local_5e0.mipLevels <= local_578[0]._M_string_length._4_4_
                                         )) && ((local_5e0.samples &
                                                local_578[0].field_2._M_allocated_capacity._4_4_) !=
                                                0)))) {
                                result.m_log = local_600;
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)&result.m_prefix);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&result.m_prefix,"- ",2);
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_578);
                                if ((ulong)local_5e0.imageType < 3) {
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_578,
                                             &DAT_00b5b4dc +
                                             *(int *)(&DAT_00b5b4dc + (ulong)local_5e0.imageType * 4
                                                     ),3);
                                }
                                if (local_5e0.tiling == VK_IMAGE_TILING_OPTIMAL) {
                                  lVar15 = 10;
                                  pcVar17 = "(optimal) ";
LAB_006a841b:
                                  std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_578,pcVar17,lVar15);
                                }
                                else if (local_5e0.tiling == VK_IMAGE_TILING_LINEAR) {
                                  lVar15 = 9;
                                  pcVar17 = "(linear) ";
                                  goto LAB_006a841b;
                                }
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_578,"extent:[",8);
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_578);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"] ",2);
                                usedMemoryTypeIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start =
                                     (pointer)::vk::getFormatName;
                                usedMemoryTypeIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_4_ = local_5e0.format;
                                poVar9 = tcu::Format::Enum<vk::VkFormat,_4UL>::toStream
                                                   ((Enum<vk::VkFormat,_4UL> *)
                                                    &usedMemoryTypeIndices,(ostream *)local_578);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_578,"samples:",8);
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_578);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_578,"flags:",6);
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_578);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_578,"usage:",6);
                                poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)local_578);
                                std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                std::__cxx11::stringbuf::str();
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_578);
                                std::ios_base::~ios_base(local_508);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&result.m_prefix,(char *)local_628,
                                           (long)DStack_620.m_deviceIface);
                                tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)&result,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                                if (local_628 != (TestLog *)&DStack_620.m_device) {
                                  operator_delete(local_628,(ulong)(DStack_620.m_device + 1));
                                }
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)&result.m_prefix);
                                std::ios_base::~ios_base((ios_base *)local_340);
                                vk = local_3e8;
                                ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&result,
                                                  local_3e8,local_588,&local_5e0,
                                                  (VkAllocationCallbacks *)0x0);
                                obj = result.m_log;
                                DStack_620.m_device = (VkDevice)result.m_prefix._M_string_length;
                                DStack_620.m_allocator =
                                     (VkAllocationCallbacks *)
                                     result.m_prefix.field_2._M_allocated_capacity;
                                local_628 = result.m_log;
                                DStack_620.m_deviceIface =
                                     (DeviceInterface *)result.m_prefix._M_dataplus._M_p;
                                ::vk::getImageMemoryRequirements
                                          (&requirements,vk,local_588,(VkImage)result.m_log);
                                local_578[0]._M_dataplus._M_p = (pointer)&local_578[0].field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_578,"ERROR: ","");
                                tcu::ResultCollector::ResultCollector(&result,local_600,local_578);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_578[0]._M_dataplus._M_p != &local_578[0].field_2) {
                                  operator_delete(local_578[0]._M_dataplus._M_p,
                                                  local_578[0].field_2._M_allocated_capacity + 1);
                                }
                                dVar5 = requirements.memoryTypeBits;
                                local_578[0]._M_dataplus._M_p = (pointer)&local_578[0].field_2;
                                usedMemoryTypeIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_00000033;
                                local_578[0]._M_dataplus._M_p =
                                     (pointer)std::__cxx11::string::_M_create
                                                        ((ulong *)local_578,
                                                         (ulong)&usedMemoryTypeIndices);
                                local_578[0].field_2._M_allocated_capacity =
                                     usedMemoryTypeIndices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                builtin_strncpy(local_578[0]._M_dataplus._M_p,
                                                "VkMemoryRequirements memoryTypeBits has no bits set"
                                                ,0x33);
                                local_578[0]._M_string_length =
                                     (size_type)
                                     usedMemoryTypeIndices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                                local_578[0]._M_dataplus._M_p
                                [(long)usedMemoryTypeIndices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start] = '\0';
                                bVar25 = tcu::ResultCollector::check(&result,dVar5 != 0,local_578);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_578[0]._M_dataplus._M_p != &local_578[0].field_2) {
                                  operator_delete(local_578[0]._M_dataplus._M_p,
                                                  local_578[0].field_2._M_allocated_capacity + 1);
                                }
                                if (bVar25) {
                                  bitsToIndices(&usedMemoryTypeIndices,requirements.memoryTypeBits);
                                  if (usedMemoryTypeIndices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start ==
                                      (pointer)CONCAT44(usedMemoryTypeIndices.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                                  (VkFormat)
                                                  usedMemoryTypeIndices.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)) {
                                    local_668 = (pointer)((ulong)local_668._4_4_ << 0x20);
                                    local_674 = 0;
                                  }
                                  else {
                                    local_674 = 0;
                                    local_668 = (pointer)((ulong)local_668._4_4_ << 0x20);
                                    puVar18 = usedMemoryTypeIndices.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start;
                                    do {
                                      if (*puVar18 < memoryProperties.memoryTypeCount) {
                                        uVar2 = memoryProperties.memoryTypes[*puVar18].propertyFlags
                                        ;
                                        uVar14 = (uint)local_668 & 0xff;
                                        if ((uVar2 & 1) != 0) {
                                          uVar14 = 1;
                                        }
                                        local_668 = (pointer)CONCAT44(local_668._4_4_,uVar14);
                                        local_674 = local_674 & 0xff;
                                        if ((uVar2 & 6) != 0) {
                                          local_674 = 1;
                                        }
                                        if ((uVar2 & 0x10) != 0) {
                                          local_5f8 = (pointer)CONCAT44(local_5f8._4_4_,
                                                                        local_5e0.usage);
                                          local_578[0]._M_dataplus._M_p =
                                               (pointer)&local_578[0].field_2;
                                          local_680 = (pointer)0x61;
                                          local_670 = puVar18;
                                          pcVar10 = (pointer)std::__cxx11::string::_M_create
                                                                       ((ulong *)local_578,
                                                                        (ulong)&local_680);
                                          local_3d8 = local_680;
                                          local_578[0].field_2._M_allocated_capacity = local_680;
                                          local_578[0]._M_dataplus._M_p = pcVar10;
                                          memcpy(pcVar10,
                                                 "Memory type includes VK_MEMORY_PROPERTY_LAZILY_ALLOCATED_BIT for a non-transient attachment image"
                                                 ,0x61);
                                          local_578[0]._M_string_length = (size_type)local_3d8;
                                          pcVar10[(long)local_3d8] = '\0';
                                          tcu::ResultCollector::check
                                                    (&result,SUB41(((uint)local_5f8 & 0x40) >> 6,0),
                                                     local_578);
                                          goto LAB_006a8995;
                                        }
                                      }
                                      else {
                                        local_578[0]._M_dataplus._M_p =
                                             (pointer)&local_578[0].field_2;
                                        local_680 = (pointer)0x4f;
                                        local_670 = puVar18;
                                        pcVar10 = (pointer)std::__cxx11::string::_M_create
                                                                     ((ulong *)local_578,
                                                                      (ulong)&local_680);
                                        local_5f8 = local_680;
                                        local_578[0].field_2._M_allocated_capacity = local_680;
                                        local_578[0]._M_dataplus._M_p = pcVar10;
                                        memcpy(pcVar10,
                                               "VkMemoryRequirements memoryTypeBits contains bits for non-existing memory types"
                                               ,0x4f);
                                        local_578[0]._M_string_length = (size_type)local_5f8;
                                        pcVar10[(long)local_5f8] = '\0';
                                        tcu::ResultCollector::fail(&result,local_578);
LAB_006a8995:
                                        puVar18 = local_670;
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_578[0]._M_dataplus._M_p !=
                                            &local_578[0].field_2) {
                                          operator_delete(local_578[0]._M_dataplus._M_p,
                                                          local_578[0].field_2._M_allocated_capacity
                                                          + 1);
                                          puVar18 = local_670;
                                        }
                                      }
                                      puVar18 = puVar18 + 1;
                                    } while (puVar18 !=
                                             (uint *)CONCAT44(usedMemoryTypeIndices.
                                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                                  (VkFormat)
                                                  usedMemoryTypeIndices.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish));
                                  }
                                  VVar4 = requirements.alignment;
                                  local_578[0]._M_dataplus._M_p = (pointer)&local_578[0].field_2;
                                  local_680 = (pointer)0x31;
                                  local_578[0]._M_dataplus._M_p =
                                       (pointer)std::__cxx11::string::_M_create
                                                          ((ulong *)local_578,(ulong)&local_680);
                                  local_578[0].field_2._M_allocated_capacity = local_680;
                                  builtin_strncpy(local_578[0]._M_dataplus._M_p,
                                                  "VkMemoryRequirements alignment isn\'t power of two"
                                                  ,0x31);
                                  local_578[0]._M_string_length = (size_type)local_680;
                                  local_578[0]._M_dataplus._M_p[(long)local_680] = '\0';
                                  tcu::ResultCollector::check
                                            (&result,(VVar4 & VVar4 - 1) == 0,local_578);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_578[0]._M_dataplus._M_p != &local_578[0].field_2) {
                                    operator_delete(local_578[0]._M_dataplus._M_p,
                                                    local_578[0].field_2._M_allocated_capacity + 1);
                                  }
                                  local_578[0]._M_dataplus._M_p = (pointer)&local_578[0].field_2;
                                  local_680 = (pointer)0x4e;
                                  pcVar10 = (pointer)std::__cxx11::string::_M_create
                                                               ((ulong *)local_578,(ulong)&local_680
                                                               );
                                  local_670 = local_680;
                                  local_578[0].field_2._M_allocated_capacity = local_680;
                                  local_578[0]._M_dataplus._M_p = pcVar10;
                                  memcpy(pcVar10,
                                         "None of the required memory types included VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT"
                                         ,0x4e);
                                  local_578[0]._M_string_length = (size_type)local_670;
                                  pcVar10[(long)local_670] = '\0';
                                  tcu::ResultCollector::check
                                            (&result,(bool)((byte)local_668 & 1),local_578);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_578[0]._M_dataplus._M_p != &local_578[0].field_2) {
                                    operator_delete(local_578[0]._M_dataplus._M_p,
                                                    local_578[0].field_2._M_allocated_capacity + 1);
                                  }
                                  local_670 = (uint *)CONCAT44(local_670._4_4_,local_5e0.tiling);
                                  local_578[0]._M_dataplus._M_p = (pointer)&local_578[0].field_2;
                                  local_680 = (pointer)0x71;
                                  pcVar10 = (pointer)std::__cxx11::string::_M_create
                                                               ((ulong *)local_578,(ulong)&local_680
                                                               );
                                  local_668 = local_680;
                                  local_578[0].field_2._M_allocated_capacity = local_680;
                                  local_578[0]._M_dataplus._M_p = pcVar10;
                                  memcpy(pcVar10,
                                         "Required memory type doesn\'t include VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT and VK_MEMORY_PROPERTY_HOST_COHERENT_BIT"
                                         ,0x71);
                                  local_578[0]._M_string_length = (size_type)local_668;
                                  pcVar10[(long)local_668] = '\0';
                                  tcu::ResultCollector::check
                                            (&result,(bool)((int)local_670 == 0 |
                                                           (byte)local_674 & 1),local_578);
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_578[0]._M_dataplus._M_p != &local_578[0].field_2) {
                                    operator_delete(local_578[0]._M_dataplus._M_p,
                                                    local_578[0].field_2._M_allocated_capacity + 1);
                                  }
                                  if (usedMemoryTypeIndices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(usedMemoryTypeIndices.
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)usedMemoryTypeIndices.
                                                                                                                
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)usedMemoryTypeIndices.
                                                                                                                    
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                }
                                dVar5 = requirements.memoryTypeBits;
                                local_578[0]._M_dataplus._M_p = (pointer)&local_578[0].field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_578,
                                           "memoryTypeBits differ from the ones in the previous image configuration"
                                           ,"");
                                tcu::ResultCollector::check
                                          (&result,dVar5 == local_678 || local_678 == 0xffffffff,
                                           local_578);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_578[0]._M_dataplus._M_p != &local_578[0].field_2) {
                                  operator_delete(local_578[0]._M_dataplus._M_p,
                                                  local_578[0].field_2._M_allocated_capacity + 1);
                                }
                                qVar8 = tcu::ResultCollector::getResult(&result);
                                uVar22 = local_3f0;
                                if (qVar8 != QP_TEST_RESULT_PASS) {
                                  bVar6 = false;
                                }
                                local_678 = requirements.memoryTypeBits;
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)result.m_message._M_dataplus._M_p !=
                                    &result.m_message.field_2) {
                                  operator_delete(result.m_message._M_dataplus._M_p,
                                                  result.m_message.field_2._M_allocated_capacity + 1
                                                 );
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)result.m_prefix._M_dataplus._M_p != &result.m_prefix.field_2)
                                {
                                  operator_delete(result.m_prefix._M_dataplus._M_p,
                                                  result.m_prefix.field_2._M_allocated_capacity + 1)
                                  ;
                                }
                                if (obj != (TestLog *)0x0) {
                                  ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::
                                  operator()(&DStack_620,(VkImage)obj);
                                }
                                local_65c = local_65c + 1;
                              }
                            }
                          }
                        }
                        else if (bVar24 && ((VVar20 == VK_IMAGE_TYPE_2D && uVar11 == 0) && bVar23))
                        goto LAB_006a8148;
                      }
LAB_006a8d4c:
                      bVar25 = VVar21 == 0;
                      VVar21 = VVar21 * 2;
                      if (bVar25) {
                        VVar21 = VK_SAMPLE_COUNT_1_BIT;
                      }
                    } while ((int)VVar21 < 0x11);
                    do {
                      bVar24 = uVar12 == 0;
                      uVar12 = uVar12 * 2;
                      if (bVar24) {
                        uVar12 = 1;
                      }
                    } while ((uVar12 & 0x40) != 0);
                    uVar16 = local_3e0;
                  } while (uVar12 < 0x81);
                  do {
                    uVar12 = (int)uVar16 * 2;
                    if ((int)uVar16 == 0) {
                      uVar12 = 1;
                    }
                    uVar16 = (ulong)uVar12;
                  } while ((uVar12 & 7) != 0);
                } while (uVar12 < 0x11);
                VVar20 = VVar20 + VK_IMAGE_TYPE_2D;
              } while (VVar20 != VK_IMAGE_TYPE_LAST);
            }
            pTVar3 = local_400;
            uVar12 = (int)local_580 + 1;
            uVar13 = (ulong)uVar12;
          } while (uVar12 != 0xb9);
          uVar16 = (ulong)((int)local_3f8 + 1);
          if ((int)local_3f8 != 0) {
            if (local_65c == 0) {
              psVar1 = &result.m_prefix;
              result.m_log = local_600;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)psVar1);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)psVar1,
                         "NOTE: No supported image configurations -- nothing to check",0x3b);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&result,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)psVar1);
              std::ios_base::~ios_base((ios_base *)local_340);
            }
            if (bVar6) {
              result.m_log = (TestLog *)&result.m_prefix._M_string_length;
              std::__cxx11::string::_M_construct<char_const*>((string *)&result,"Pass","");
              pTVar3->m_code = QP_TEST_RESULT_PASS;
              (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pTVar3->m_description,result.m_log,
                         result.m_prefix._M_dataplus._M_p + (long)result.m_log);
            }
            else {
              result.m_log = (TestLog *)&result.m_prefix._M_string_length;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&result,"Some memory requirements were incorrect","");
              pTVar3->m_code = QP_TEST_RESULT_FAIL;
              (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&pTVar3->m_description,result.m_log,
                         result.m_prefix._M_dataplus._M_p + (long)result.m_log);
            }
            if (result.m_log != (TestLog *)&result.m_prefix._M_string_length) {
              operator_delete(result.m_log,result.m_prefix._M_string_length + 1);
            }
            return pTVar3;
          }
        } while( true );
      }
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Feature not supported: sparseResidencyAliased",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
                 ,0x10d);
    }
    else {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"Feature not supported: sparseResidencyImage (2D and 3D)",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
                 ,0x10a);
    }
  }
  else {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Feature not supported: sparseBinding",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryRequirementsTests.cpp"
               ,0x107);
  }
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus testImage (Context& context, const ImageParams params)
{
	const DeviceInterface&		vk				= context.getDeviceInterface();
	const InstanceInterface&	vki				= context.getInstanceInterface();
	const VkDevice				device			= context.getDevice();
	const VkPhysicalDevice		physDevice		= context.getPhysicalDevice();
	const VkImageCreateFlags	sparseFlags		= VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT | VK_IMAGE_CREATE_SPARSE_ALIASED_BIT;
	const VkImageUsageFlags		transientFlags	= VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT;

	requireImageSparseFeatures(vki, physDevice, params.flags);

	const VkPhysicalDeviceMemoryProperties	memoryProperties		= getPhysicalDeviceMemoryProperties(vki, physDevice);
	const deUint32							notInitializedBits		= ~0u;
	const VkImageAspectFlags				colorAspect				= VK_IMAGE_ASPECT_COLOR_BIT;
	const VkImageAspectFlags				depthStencilAspect		= VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
	const VkImageAspectFlags				allAspects[2]			= { colorAspect, depthStencilAspect };
	tcu::TestLog&							log						= context.getTestContext().getLog();
	bool									allPass					= true;
	deUint32								numCheckedImages		= 0u;

	log << tcu::TestLog::Message << "Verify memory requirements for the following parameter combinations:" << tcu::TestLog::EndMessage;

	for (deUint32 loopAspectNdx = 0u; loopAspectNdx < DE_LENGTH_OF_ARRAY(allAspects); ++loopAspectNdx)
	{
		const VkImageAspectFlags	aspect					= allAspects[loopAspectNdx];
		deUint32					previousMemoryTypeBits	= notInitializedBits;

		for (VkFormat loopFormat = VK_FORMAT_R4G4_UNORM_PACK8; loopFormat <= VK_FORMAT_ASTC_12x12_SRGB_BLOCK; loopFormat = nextEnum(loopFormat))
		if  (isFormatMatchingAspect(loopFormat, aspect))
		{
			// memoryTypeBits may differ between depth/stencil formats
			if (aspect == depthStencilAspect)
				previousMemoryTypeBits = notInitializedBits;

			for (VkImageType			loopImageType	= VK_IMAGE_TYPE_1D;					loopImageType	!= VK_IMAGE_TYPE_LAST;					loopImageType	= nextEnum(loopImageType))
			for (VkImageCreateFlags		loopCreateFlags	= (VkImageCreateFlags)0;			loopCreateFlags	<= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;	loopCreateFlags	= nextFlagExcluding(loopCreateFlags, sparseFlags))
			for (VkImageUsageFlags		loopUsageFlags	= VK_IMAGE_USAGE_TRANSFER_SRC_BIT;	loopUsageFlags	<= VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;	loopUsageFlags	= nextFlagExcluding(loopUsageFlags, transientFlags))
			for (VkSampleCountFlagBits	loopSampleCount	= VK_SAMPLE_COUNT_1_BIT;			loopSampleCount	<= VK_SAMPLE_COUNT_16_BIT;				loopSampleCount	= nextFlag(loopSampleCount))
			{
				const VkImageCreateFlags	actualCreateFlags	= loopCreateFlags | params.flags;
				const VkImageUsageFlags		actualUsageFlags	= loopUsageFlags  | (params.transient ? VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT : (VkImageUsageFlagBits)0);
				const bool					isCube				= (actualCreateFlags & VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT) != 0u;
				const VkImageCreateInfo		imageInfo			=
				{
					VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType          sType;
					DE_NULL,									// const void*              pNext;
					actualCreateFlags,							// VkImageCreateFlags       flags;
					loopImageType,								// VkImageType              imageType;
					loopFormat,									// VkFormat                 format;
					makeExtentForImage(loopImageType),			// VkExtent3D               extent;
					1u,											// uint32_t                 mipLevels;
					(isCube ? 6u : 1u),							// uint32_t                 arrayLayers;
					loopSampleCount,							// VkSampleCountFlagBits    samples;
					params.tiling,								// VkImageTiling            tiling;
					actualUsageFlags,							// VkImageUsageFlags        usage;
					VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode            sharingMode;
					0u,											// uint32_t                 queueFamilyIndexCount;
					DE_NULL,									// const uint32_t*          pQueueFamilyIndices;
					VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout            initialLayout;
				};

				if (!isImageSupported(vki, physDevice, imageInfo))
					continue;

				log << tcu::TestLog::Message << "- " << getImageInfoString(imageInfo) << tcu::TestLog::EndMessage;
				++numCheckedImages;

				const Unique<VkImage>		image			(createImage(vk, device, &imageInfo));
				const VkMemoryRequirements	requirements	= getImageMemoryRequirements(vk, device, *image);
				tcu::ResultCollector		result			(log, "ERROR: ");

				verifyImageRequirements(result, memoryProperties, requirements, imageInfo);

				// For the same tiling, transient usage, and sparse flags, (and format, if D/S) memoryTypeBits must be the same for all images
				result.check((previousMemoryTypeBits == notInitializedBits) || (requirements.memoryTypeBits == previousMemoryTypeBits),
								"memoryTypeBits differ from the ones in the previous image configuration");

				if (result.getResult() != QP_TEST_RESULT_PASS)
					allPass = false;

				previousMemoryTypeBits = requirements.memoryTypeBits;
			}
		}
	}

	if (numCheckedImages == 0u)
		log << tcu::TestLog::Message << "NOTE: No supported image configurations -- nothing to check" << tcu::TestLog::EndMessage;

	return allPass ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Some memory requirements were incorrect");
}